

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_59::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  ulong uVar1;
  uchar *puVar2;
  long lVar3;
  uint64_t uVar4;
  Fault f;
  uint64_t offset_local;
  uint64_t end;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  if (zeroSize != 0) {
    _kjCondition.left = (unsigned_long *)((ulong)_kjCondition.left & 0xffffffffffffff00);
    offset_local = offset;
    kj::_::Mutex::lock(&(this->impl).mutex,0,&_kjCondition);
    lVar3 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
    (this->impl).value.lastModified.value.value = lVar3;
    end = zeroSize + offset;
    _kjCondition.left = &end;
    _kjCondition.right = &offset_local;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = end >= offset;
    if (end < offset) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[32]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x355,FAILED,"end >= offset","_kjCondition,\"zero() request overflows uint64\"",
                 &_kjCondition,(char (*) [32])"zero() request overflows uint64");
      kj::_::Debug::Fault::fatal(&f);
    }
    Impl::ensureCapacity(&(this->impl).value,end);
    uVar1 = (this->impl).value.size;
    uVar4 = end;
    if (end < uVar1) {
      uVar4 = uVar1;
    }
    puVar2 = (this->impl).value.bytes.ptr;
    (this->impl).value.size = uVar4;
    memset(puVar2 + offset_local,0,zeroSize);
    kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }